

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code_sink.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::CodeSinkingPass::ReferencesMutableMemory(CodeSinkingPass *this,Instruction *inst)

{
  bool bVar1;
  Op OVar2;
  uint32_t uVar3;
  Instruction *this_00;
  Instruction *base_ptr;
  Instruction *inst_local;
  CodeSinkingPass *this_local;
  
  bVar1 = opt::Instruction::IsLoad(inst);
  if (bVar1) {
    this_00 = opt::Instruction::GetBaseAddress(inst);
    OVar2 = opt::Instruction::opcode(this_00);
    if (OVar2 == OpVariable) {
      bVar1 = opt::Instruction::IsReadOnlyPointer(this_00);
      if (bVar1) {
        this_local._7_1_ = false;
      }
      else {
        bVar1 = HasUniformMemorySync(this);
        if (bVar1) {
          this_local._7_1_ = true;
        }
        else {
          uVar3 = opt::Instruction::GetSingleWordInOperand(this_00,0);
          if (uVar3 == 2) {
            this_local._7_1_ = HasPossibleStore(this,this_00);
          }
          else {
            this_local._7_1_ = true;
          }
        }
      }
    }
    else {
      this_local._7_1_ = true;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool CodeSinkingPass::ReferencesMutableMemory(Instruction* inst) {
  if (!inst->IsLoad()) {
    return false;
  }

  Instruction* base_ptr = inst->GetBaseAddress();
  if (base_ptr->opcode() != spv::Op::OpVariable) {
    return true;
  }

  if (base_ptr->IsReadOnlyPointer()) {
    return false;
  }

  if (HasUniformMemorySync()) {
    return true;
  }

  if (spv::StorageClass(base_ptr->GetSingleWordInOperand(0)) !=
      spv::StorageClass::Uniform) {
    return true;
  }

  return HasPossibleStore(base_ptr);
}